

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  pointer ppcVar1;
  pointer pbVar2;
  cmCommandArgument *this_00;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  pointer ppcVar6;
  cmCommandArgument *pcVar7;
  cmCommandArgument *current;
  string *it;
  pointer __x;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range1;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    ppcVar1 = (this->Arguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar6 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      pcVar7 = *ppcVar6;
      cmCommandArgument::ApplyOwnGroup(pcVar7);
      pcVar7->WasActive = false;
      pcVar7->CurrentIndex = 0;
      (*pcVar7->_vptr_cmCommandArgument[3])(pcVar7);
    }
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__x != pbVar2) {
      pcVar7 = (cmCommandArgument *)0x0;
      current = (cmCommandArgument *)0x0;
      do {
        ppcVar1 = (this->Arguments).
                  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar6 = (this->Arguments).
                       super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
            ppcVar6 = ppcVar6 + 1) {
          this_00 = *ppcVar6;
          if ((((this_00->Key == (char *)0x0) || (*this_00->Key == '\0')) ||
              (iVar4 = std::__cxx11::string::compare((char *)__x), iVar4 == 0)) &&
             (bVar3 = cmCommandArgument::MayFollow(this_00,current), bVar3)) {
            this_00->WasActive = true;
            this_00->CurrentIndex = 0;
            uVar5 = 0;
            current = this_00;
            goto LAB_00367895;
          }
        }
        if (pcVar7 == (cmCommandArgument *)0x0) {
          if (unconsumedArgs !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(unconsumedArgs,__x);
          }
          pcVar7 = (cmCommandArgument *)0x0;
        }
        else {
          uVar5 = (ulong)pcVar7->CurrentIndex;
          current = pcVar7;
LAB_00367895:
          iVar4 = (*current->_vptr_cmCommandArgument[2])(current,__x,uVar5);
          current->CurrentIndex = current->CurrentIndex + 1;
          pcVar7 = (cmCommandArgument *)0x0;
          if ((char)iVar4 == '\0') {
            pcVar7 = current;
          }
        }
        __x = __x + 1;
      } while (__x != pbVar2);
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == nullptr) {
    return;
  }

  for (cmCommandArgument* ca : this->Arguments) {
    ca->ApplyOwnGroup();
    ca->Reset();
  }

  cmCommandArgument* activeArgument = nullptr;
  const cmCommandArgument* previousArgument = nullptr;
  for (std::string const& it : *args) {
    for (cmCommandArgument* ca : this->Arguments) {
      if (ca->KeyMatches(it) && (ca->MayFollow(previousArgument))) {
        activeArgument = ca;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = nullptr;
      }
    } else {
      if (unconsumedArgs != nullptr) {
        unconsumedArgs->push_back(it);
      }
    }
  }
}